

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O2

decNumber_conflict * decNumberFromUInt32(decNumber_conflict *dn,uint32_t uin)

{
  int32_t iVar1;
  long lVar2;
  
  dn->bits = '\0';
  dn->digits = 1;
  dn->exponent = 0;
  dn->lsu[0] = 0;
  if (uin != 0) {
    lVar2 = 0;
    for (; uin != 0; uin = uin / 1000) {
      dn->lsu[lVar2] = (uint16_t)(uin % 1000);
      lVar2 = lVar2 + 1;
    }
    iVar1 = decGetDigits(dn->lsu,(int32_t)lVar2);
    dn->digits = iVar1;
  }
  return dn;
}

Assistant:

decNumber * decNumberFromUInt32(decNumber *dn, uInt uin) {
  Unit *up;				/* work pointer */
  decNumberZero(dn);			/* clean */
  if (uin==0) return dn;		/* [or decGetDigits bad call] */
  for (up=dn->lsu; uin>0; up++) {
    *up=(Unit)(uin%(DECDPUNMAX+1));
    uin=uin/(DECDPUNMAX+1);
    }
  dn->digits=decGetDigits(dn->lsu, up-dn->lsu);
  return dn;
  }